

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

string_view __thiscall google::protobuf::io::Printer::Sub::value(Sub *this)

{
  LogMessage *pLVar1;
  string_view sVar2;
  LogMessage local_40;
  Voidify local_29;
  StringType *local_28;
  StringType *str;
  Sub *this_local;
  
  str = &this->key_;
  local_28 = ValueImpl<true>::AsString_abi_cxx11_(&this->value_);
  if (local_28 != (StringType *)0x0) {
    sVar2 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    return sVar2;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h"
             ,0x3ea,"str != nullptr");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [16])"could not find ");
  sVar2 = key(this);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,sVar2);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [25])"; found callback instead");
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

absl::string_view value() const {
    const auto* str = value_.AsString();
    ABSL_CHECK(str != nullptr)
        << "could not find " << key() << "; found callback instead";
    return *str;
  }